

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(Model *a,Model *b)

{
  code *pcVar1;
  bool bVar2;
  __type _Var3;
  int32 iVar4;
  int32 iVar5;
  TypeCase TVar6;
  TypeCase TVar7;
  ModelDescription *a_00;
  ModelDescription *b_00;
  PipelineClassifier *a_01;
  PipelineClassifier *b_01;
  PipelineRegressor *a_02;
  PipelineRegressor *b_02;
  Pipeline *a_03;
  Pipeline *b_03;
  GLMRegressor *a_04;
  GLMRegressor *b_04;
  SupportVectorRegressor *a_05;
  SupportVectorRegressor *b_05;
  TreeEnsembleRegressor *a_06;
  TreeEnsembleRegressor *b_06;
  NeuralNetworkRegressor *a_07;
  NeuralNetworkRegressor *b_07;
  GLMClassifier *a_08;
  GLMClassifier *b_08;
  SupportVectorClassifier *a_09;
  SupportVectorClassifier *b_09;
  TreeEnsembleClassifier *a_10;
  TreeEnsembleClassifier *b_10;
  NeuralNetworkClassifier *a_11;
  NeuralNetworkClassifier *b_11;
  NeuralNetwork *a_12;
  NeuralNetwork *b_12;
  SerializedModel *pSVar8;
  string *psVar9;
  string *psVar10;
  BayesianProbitRegressor *a_13;
  BayesianProbitRegressor *b_13;
  OneHotEncoder *a_14;
  OneHotEncoder *b_14;
  Imputer *a_15;
  Imputer *b_15;
  FeatureVectorizer *a_16;
  FeatureVectorizer *b_16;
  DictVectorizer *a_17;
  DictVectorizer *b_17;
  Scaler *a_18;
  Scaler *b_18;
  NonMaximumSuppression *a_19;
  NonMaximumSuppression *b_19;
  CategoricalMapping *a_20;
  CategoricalMapping *b_20;
  Normalizer *a_21;
  Normalizer *b_21;
  ArrayFeatureExtractor *a_22;
  ArrayFeatureExtractor *b_22;
  CustomModel *a_23;
  CustomModel *b_23;
  WordTagger *a_24;
  WordTagger *b_24;
  TextClassifier *a_25;
  TextClassifier *b_25;
  Gazetteer *a_26;
  Gazetteer *b_26;
  WordEmbedding *a_27;
  WordEmbedding *b_27;
  VisionFeaturePrint *a_28;
  VisionFeaturePrint *b_28;
  KNearestNeighborsClassifier *a_29;
  KNearestNeighborsClassifier *b_29;
  ItemSimilarityRecommender *a_30;
  ItemSimilarityRecommender *b_30;
  SoundAnalysisPreprocessing *a_31;
  SoundAnalysisPreprocessing *b_31;
  LinkedModel *a_32;
  LinkedModel *b_32;
  undefined1 local_99;
  Model *b_local;
  Model *a_local;
  
  iVar4 = Model::specificationversion(a);
  iVar5 = Model::specificationversion(b);
  if (iVar4 == iVar5) {
    a_00 = Model::description(a);
    b_00 = Model::description(b);
    bVar2 = operator!=(a_00,b_00);
    if (bVar2) {
      a_local._7_1_ = false;
    }
    else {
      TVar6 = Model::Type_case(a);
      TVar7 = Model::Type_case(b);
      if (TVar6 == TVar7) {
        TVar6 = Model::Type_case(a);
        if (TVar6 == TYPE_NOT_SET) {
          a_local._7_1_ = true;
        }
        else if (TVar6 == kPipelineClassifier) {
          a_01 = Model::pipelineclassifier(a);
          b_01 = Model::pipelineclassifier(b);
          a_local._7_1_ = operator==(a_01,b_01);
        }
        else if (TVar6 == kPipelineRegressor) {
          a_02 = Model::pipelineregressor(a);
          b_02 = Model::pipelineregressor(b);
          a_local._7_1_ = operator==(a_02,b_02);
        }
        else if (TVar6 == kPipeline) {
          a_03 = Model::pipeline(a);
          b_03 = Model::pipeline(b);
          a_local._7_1_ = operator==(a_03,b_03);
        }
        else if (TVar6 == kGlmRegressor) {
          a_04 = Model::glmregressor(a);
          b_04 = Model::glmregressor(b);
          a_local._7_1_ = operator==(a_04,b_04);
        }
        else if (TVar6 == kSupportVectorRegressor) {
          a_05 = Model::supportvectorregressor(a);
          b_05 = Model::supportvectorregressor(b);
          a_local._7_1_ = operator==(a_05,b_05);
        }
        else if (TVar6 == kTreeEnsembleRegressor) {
          a_06 = Model::treeensembleregressor(a);
          b_06 = Model::treeensembleregressor(b);
          a_local._7_1_ = operator==(a_06,b_06);
        }
        else if (TVar6 == kNeuralNetworkRegressor) {
          a_07 = Model::neuralnetworkregressor(a);
          b_07 = Model::neuralnetworkregressor(b);
          a_local._7_1_ = operator==(a_07,b_07);
        }
        else if (TVar6 == kBayesianProbitRegressor) {
          a_13 = Model::bayesianprobitregressor(a);
          b_13 = Model::bayesianprobitregressor(b);
          a_local._7_1_ = operator==(a_13,b_13);
        }
        else if (TVar6 == kGlmClassifier) {
          a_08 = Model::glmclassifier(a);
          b_08 = Model::glmclassifier(b);
          a_local._7_1_ = operator==(a_08,b_08);
        }
        else if (TVar6 == kSupportVectorClassifier) {
          a_09 = Model::supportvectorclassifier(a);
          b_09 = Model::supportvectorclassifier(b);
          a_local._7_1_ = operator==(a_09,b_09);
        }
        else if (TVar6 == kTreeEnsembleClassifier) {
          a_10 = Model::treeensembleclassifier(a);
          b_10 = Model::treeensembleclassifier(b);
          a_local._7_1_ = operator==(a_10,b_10);
        }
        else if (TVar6 == kNeuralNetworkClassifier) {
          a_11 = Model::neuralnetworkclassifier(a);
          b_11 = Model::neuralnetworkclassifier(b);
          a_local._7_1_ = operator==(a_11,b_11);
        }
        else if (TVar6 == kKNearestNeighborsClassifier) {
          a_29 = Model::knearestneighborsclassifier(a);
          b_29 = Model::knearestneighborsclassifier(b);
          a_local._7_1_ = operator==(a_29,b_29);
        }
        else if (TVar6 == kNeuralNetwork) {
          a_12 = Model::neuralnetwork(a);
          b_12 = Model::neuralnetwork(b);
          a_local._7_1_ = operator==(a_12,b_12);
        }
        else if (TVar6 == kItemSimilarityRecommender) {
          a_30 = Model::itemsimilarityrecommender(a);
          b_30 = Model::itemsimilarityrecommender(b);
          a_local._7_1_ = operator==(a_30,b_30);
        }
        else if (TVar6 == kCustomModel) {
          a_23 = Model::custommodel(a);
          b_23 = Model::custommodel(b);
          a_local._7_1_ = operator==(a_23,b_23);
        }
        else if (TVar6 == kLinkedModel) {
          a_32 = Model::linkedmodel(a);
          b_32 = Model::linkedmodel(b);
          a_local._7_1_ = operator==(a_32,b_32);
        }
        else if (TVar6 == kOneHotEncoder) {
          a_14 = Model::onehotencoder(a);
          b_14 = Model::onehotencoder(b);
          a_local._7_1_ = operator==(a_14,b_14);
        }
        else if (TVar6 == kImputer) {
          a_15 = Model::imputer(a);
          b_15 = Model::imputer(b);
          a_local._7_1_ = operator==(a_15,b_15);
        }
        else if (TVar6 == kFeatureVectorizer) {
          a_16 = Model::featurevectorizer(a);
          b_16 = Model::featurevectorizer(b);
          a_local._7_1_ = operator==(a_16,b_16);
        }
        else if (TVar6 == kDictVectorizer) {
          a_17 = Model::dictvectorizer(a);
          b_17 = Model::dictvectorizer(b);
          a_local._7_1_ = operator==(a_17,b_17);
        }
        else if (TVar6 == kScaler) {
          a_18 = Model::scaler(a);
          b_18 = Model::scaler(b);
          a_local._7_1_ = operator==(a_18,b_18);
        }
        else if (TVar6 == kCategoricalMapping) {
          a_20 = Model::categoricalmapping(a);
          b_20 = Model::categoricalmapping(b);
          a_local._7_1_ = operator==(a_20,b_20);
        }
        else if (TVar6 == kNormalizer) {
          a_21 = Model::normalizer(a);
          b_21 = Model::normalizer(b);
          a_local._7_1_ = operator==(a_21,b_21);
        }
        else if (TVar6 == kArrayFeatureExtractor) {
          a_22 = Model::arrayfeatureextractor(a);
          b_22 = Model::arrayfeatureextractor(b);
          a_local._7_1_ = operator==(a_22,b_22);
        }
        else if (TVar6 == kNonMaximumSuppression) {
          a_19 = Model::nonmaximumsuppression(a);
          b_19 = Model::nonmaximumsuppression(b);
          a_local._7_1_ = operator==(a_19,b_19);
        }
        else if (TVar6 == kIdentity) {
          a_local._7_1_ = true;
        }
        else if (TVar6 == kTextClassifier) {
          a_25 = Model::textclassifier(a);
          b_25 = Model::textclassifier(b);
          a_local._7_1_ = operator==(a_25,b_25);
        }
        else if (TVar6 == kWordTagger) {
          a_24 = Model::wordtagger(a);
          b_24 = Model::wordtagger(b);
          a_local._7_1_ = operator==(a_24,b_24);
        }
        else if (TVar6 == kVisionFeaturePrint) {
          a_28 = Model::visionfeatureprint(a);
          b_28 = Model::visionfeatureprint(b);
          a_local._7_1_ = operator==(a_28,b_28);
        }
        else if (TVar6 == kSoundAnalysisPreprocessing) {
          a_31 = Model::soundanalysispreprocessing(a);
          b_31 = Model::soundanalysispreprocessing(b);
          a_local._7_1_ = operator==(a_31,b_31);
        }
        else if (TVar6 == kGazetteer) {
          a_26 = Model::gazetteer(a);
          b_26 = Model::gazetteer(b);
          a_local._7_1_ = operator==(a_26,b_26);
        }
        else if (TVar6 == kWordEmbedding) {
          a_27 = Model::wordembedding(a);
          b_27 = Model::wordembedding(b);
          a_local._7_1_ = operator==(a_27,b_27);
        }
        else {
          if (TVar6 != kSerializedModel) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          pSVar8 = Model::serializedmodel(a);
          psVar9 = SerializedModel::identifier_abi_cxx11_(pSVar8);
          pSVar8 = Model::serializedmodel(b);
          psVar10 = SerializedModel::identifier_abi_cxx11_(pSVar8);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)psVar9,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)psVar10);
          local_99 = false;
          if (_Var3) {
            pSVar8 = Model::serializedmodel(a);
            psVar9 = SerializedModel::model_abi_cxx11_(pSVar8);
            pSVar8 = Model::serializedmodel(b);
            psVar10 = SerializedModel::model_abi_cxx11_(pSVar8);
            local_99 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)psVar9,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)psVar10);
          }
          a_local._7_1_ = local_99;
        }
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const Model& a, const Model& b) {
            if (a.specificationversion() != b.specificationversion()) {
                return false;
            }
            if (a.description() != b.description()) {
                return false;
            }
            if (a.Type_case() != b.Type_case()) {
                return false;
            }
            
            // if everything else matches, check the model-specific parameters
            switch (a.Type_case()) {
                case Model::kPipelineClassifier:
                    return a.pipelineclassifier() == b.pipelineclassifier();
                case Model::kPipelineRegressor:
                    return a.pipelineregressor() == b.pipelineregressor();
                case Model::kPipeline:
                    return a.pipeline() == b.pipeline();
                case Model::kGlmRegressor:
                    return a.glmregressor() == b.glmregressor();
                case Model::kSupportVectorRegressor:
                    return a.supportvectorregressor() == b.supportvectorregressor();
                case Model::kTreeEnsembleRegressor:
                    return a.treeensembleregressor() == b.treeensembleregressor();
                case Model::kNeuralNetworkRegressor:
                    return a.neuralnetworkregressor() == b.neuralnetworkregressor();
                case Model::kGlmClassifier:
                    return a.glmclassifier() == b.glmclassifier();
                case Model::kSupportVectorClassifier:
                    return a.supportvectorclassifier() == b.supportvectorclassifier();
                case Model::kTreeEnsembleClassifier:
                    return a.treeensembleclassifier() == b.treeensembleclassifier();
                case Model::kNeuralNetworkClassifier:
                    return a.neuralnetworkclassifier() == b.neuralnetworkclassifier();
                case Model::kNeuralNetwork:
                    return a.neuralnetwork() == b.neuralnetwork();
                case Model::kSerializedModel:
                    return a.serializedmodel().identifier() == b.serializedmodel().identifier() &&
                           a.serializedmodel().model() == b.serializedmodel().model();
                case Model::kBayesianProbitRegressor:
                    return a.bayesianprobitregressor() == b.bayesianprobitregressor();
                case Model::kOneHotEncoder:
                    return a.onehotencoder() == b.onehotencoder();
                case Model::kImputer:
                    return a.imputer() == b.imputer();
                case Model::kFeatureVectorizer:
                    return a.featurevectorizer() == b.featurevectorizer();
                case Model::kDictVectorizer:
                    return a.dictvectorizer() == b.dictvectorizer();
                case Model::kScaler:
                    return a.scaler() == b.scaler();
                case Model::kNonMaximumSuppression:
                    return a.nonmaximumsuppression() == b.nonmaximumsuppression();
                case Model::kCategoricalMapping:
                    return a.categoricalmapping() == b.categoricalmapping();
                case Model::kNormalizer:
                    return a.normalizer() == b.normalizer();
                case Model::kArrayFeatureExtractor:
                    return a.arrayfeatureextractor() == b.arrayfeatureextractor();
                case Model::kIdentity:
                    return true;
                case Model::kCustomModel:
                    return a.custommodel() == b.custommodel();
                case Model::kWordTagger:
                    return a.wordtagger() == b.wordtagger();
                case Model::kTextClassifier:
                    return a.textclassifier() == b.textclassifier();
                case Model::kGazetteer:
                    return a.gazetteer() == b.gazetteer();
                case Model::kWordEmbedding:
                    return a.wordembedding() == b.wordembedding();
                case Model::kVisionFeaturePrint:
                    return a.visionfeatureprint() == b.visionfeatureprint();
                case Model::kKNearestNeighborsClassifier:
                    return a.knearestneighborsclassifier() == b.knearestneighborsclassifier();
                case Model::kItemSimilarityRecommender:
                    return a.itemsimilarityrecommender() == b.itemsimilarityrecommender();
                case Model::kSoundAnalysisPreprocessing:
                    return a.soundanalysispreprocessing() == b.soundanalysispreprocessing();
                case Model::kLinkedModel:
                    return a.linkedmodel() == b.linkedmodel();
                case Model::TYPE_NOT_SET:
                    return true;
            }
        }